

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_ptr.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,100);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,200);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    int arr[10] = {100, 200, 300};

    int (*p)[10] = &arr;

    std::cout << arr[0] << std::endl;
    std::cout << (*p)[1] << std::endl;

    // int (*p1)[20] = &arr;

    return 0;
}